

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O3

uint __thiscall
llvm::format_object_base::print(format_object_base *this,char *Buffer,uint BufferSize)

{
  uint uVar1;
  uint uVar2;
  
  if (BufferSize != 0) {
    uVar2 = (*this->_vptr_format_object_base[1])();
    uVar1 = (uVar2 + 1) - (uint)(uVar2 < BufferSize);
    if ((int)uVar2 < 0) {
      uVar1 = BufferSize * 2;
    }
    return uVar1;
  }
  __assert_fail("BufferSize && \"Invalid buffer size!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Format.h"
                ,0x37,"unsigned int llvm::format_object_base::print(char *, unsigned int) const");
}

Assistant:

unsigned print(char *Buffer, unsigned BufferSize) const {
    assert(BufferSize && "Invalid buffer size!");

    // Print the string, leaving room for the terminating null.
    int N = snprint(Buffer, BufferSize);

    // VC++ and old GlibC return negative on overflow, just double the size.
    if (N < 0)
      return BufferSize * 2;

    // Other implementations yield number of bytes needed, not including the
    // final '\0'.
    if (unsigned(N) >= BufferSize)
      return N + 1;

    // Otherwise N is the length of output (not including the final '\0').
    return N;
  }